

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveFile::writeSymData(CDirectiveFile *this,SymbolData *symData)

{
  int iVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  SymbolData *symData_local;
  CDirectiveFile *this_local;
  
  iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
  if (iVar1 != 0) {
    if (iVar1 - 1U < 3) {
      peVar3 = std::
               __shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->file);
      (*(peVar3->super_AssemblerFile)._vptr_AssemblerFile[0xd])(peVar3,symData);
    }
    else if ((iVar1 == 4) &&
            (bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->closeFile),
            bVar2)) {
      peVar4 = std::__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->closeFile);
      (*peVar4->_vptr_AssemblerFile[0xe])(peVar4,symData);
    }
  }
  return;
}

Assistant:

void CDirectiveFile::writeSymData(SymbolData& symData) const
{
	switch (type)
	{
	case Type::Open:
	case Type::Create:
	case Type::Copy:
		file->beginSymData(symData);
		break;
	case Type::Close:
		if (closeFile)
			closeFile->endSymData(symData);
		break;
	case Type::Invalid:
		// TODO: Assert?
		break;
	}
}